

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.h
# Opt level: O1

PrimInfo * __thiscall
embree::sse2::GridMeshISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,GridMeshISA *this,mvector<PrimRef> *prims,
          mvector<SubGridBuildData> *sgrids,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  ushort uVar2;
  ushort uVar3;
  char *pcVar4;
  size_t sVar5;
  PrimRef *pPVar6;
  undefined1 auVar7 [16];
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  uint uVar12;
  BufferView<embree::Vec3fa> *pBVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  size_t index;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [16];
  long lVar29;
  ulong uVar30;
  undefined4 uVar31;
  bool bVar32;
  bool bVar33;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar34;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar35;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar36;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar37;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar38;
  undefined1 auVar39 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar40;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar41;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar42;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar43;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar44;
  undefined1 auVar45 [16];
  size_t local_98;
  size_t local_90;
  uint local_40;
  
  aVar34 = _DAT_01feb9f0;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       _DAT_01feb9f0;
  aVar35 = _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar34;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar35;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  aVar11 = _DAT_01feba00;
  aVar9 = _DAT_01feb9f0;
  aVar10 = _DAT_01feba00;
  aVar8 = _DAT_01feb9f0;
  uVar18 = r->_begin;
  local_98 = __return_storage_ptr__->end;
  aVar36 = aVar35;
  aVar37 = aVar34;
  local_90 = k;
  if (uVar18 < r->_end) {
    do {
      if (uVar18 < *(ulong *)&(this->super_GridMesh).field_0x70) {
        lVar29 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
        uVar24 = (this->super_GridMesh).vertices0.super_RawBufferView.num;
        lVar23 = *(long *)&(this->super_GridMesh).field_0x68 * uVar18;
        uVar15 = *(uint *)(lVar29 + lVar23);
        if (uVar15 < uVar24) {
          uVar2 = *(ushort *)(lVar29 + 10 + lVar23);
          uVar16 = (ulong)uVar2;
          uVar12 = *(uint *)(lVar29 + 4 + lVar23);
          uVar3 = *(ushort *)(lVar29 + 8 + lVar23);
          if (((uint)uVar3 + uVar12 * (uVar2 - 1) + uVar15) - 1 < uVar24) {
            bVar33 = uVar16 != 0;
            if (bVar33) {
              pBVar13 = (this->super_GridMesh).vertices.items;
              uVar24 = 0;
              do {
                if (uVar3 != 0) {
                  uVar26 = 0;
                  do {
                    bVar32 = true;
                    lVar29 = 0;
                    while (bVar32) {
                      pcVar4 = pBVar13[lVar29].super_RawBufferView.ptr_ofs;
                      pfVar1 = (float *)(pcVar4 + pBVar13[lVar29].super_RawBufferView.stride *
                                                  (uVar24 * uVar12 + (ulong)uVar15 + uVar26));
                      auVar39._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
                      auVar39._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
                      auVar39._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
                      auVar39._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
                      uVar31 = movmskps((int)pcVar4,auVar39);
                      lVar29 = 1;
                      bVar32 = false;
                      if ((~(byte)uVar31 & 7) != 0) {
                        if (bVar33) goto LAB_00ac610b;
                        goto LAB_00ac5e9a;
                      }
                    }
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != uVar3);
                }
                uVar24 = uVar24 + 1;
                bVar33 = uVar24 < uVar16;
              } while (uVar24 != uVar16);
            }
LAB_00ac5e9a:
            lVar29 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
            lVar23 = *(long *)&(this->super_GridMesh).field_0x68 * uVar18;
            if (*(short *)(lVar29 + 10 + lVar23) != 1) {
              uVar15 = 0;
              do {
                uVar2 = *(ushort *)(lVar29 + 8 + lVar23);
                uVar12 = (uint)uVar2;
                if (uVar2 != 1) {
                  uVar16 = (ulong)uVar15;
                  uVar24 = uVar16 + 3;
                  uVar14 = 0;
                  do {
                    uVar30 = (ulong)uVar14;
                    uVar26 = (ulong)(this->super_GridMesh).super_Geometry.numTimeSteps;
                    bVar33 = uVar26 != 0;
                    aVar42 = aVar8;
                    aVar38 = aVar10;
                    if (bVar33) {
                      uVar2 = *(ushort *)(lVar29 + 10 + lVar23);
                      uVar21 = (ulong)uVar2;
                      uVar17 = uVar21;
                      if (uVar24 < uVar21) {
                        uVar17 = uVar24;
                      }
                      uVar22 = uVar30 + 3;
                      if ((ulong)uVar12 <= uVar30 + 3) {
                        uVar22 = (ulong)uVar12;
                      }
                      uVar20 = 0;
                      uVar19 = uVar24;
                      aVar40 = aVar11;
                      aVar43 = aVar9;
                      do {
                        local_40 = (uint)uVar2;
                        if (uVar15 < local_40) {
                          pBVar13 = (this->super_GridMesh).vertices.items + uVar20;
                          uVar27 = uVar16;
                          bVar32 = uVar16 < uVar21;
                          do {
                            if (uVar14 < uVar12) {
                              sVar5 = (pBVar13->super_RawBufferView).stride;
                              pauVar28 = (undefined1 (*) [16])
                                         ((pBVar13->super_RawBufferView).ptr_ofs +
                                         (*(uint *)(lVar29 + lVar23) + uVar30 +
                                         *(uint *)(lVar29 + 4 + lVar23) * uVar27) * sVar5);
                              uVar25 = uVar30;
                              do {
                                auVar39 = *pauVar28;
                                auVar7._4_4_ = -(uint)(auVar39._4_4_ < 1.844e+18 &&
                                                      -1.844e+18 < auVar39._4_4_);
                                auVar7._0_4_ = -(uint)(auVar39._0_4_ < 1.844e+18 &&
                                                      -1.844e+18 < auVar39._0_4_);
                                auVar7._8_4_ = -(uint)(auVar39._8_4_ < 1.844e+18 &&
                                                      -1.844e+18 < auVar39._8_4_);
                                auVar7._12_4_ =
                                     -(uint)(auVar39._12_4_ < 1.844e+18 &&
                                            -1.844e+18 < auVar39._12_4_);
                                uVar31 = movmskps((int)uVar19,auVar7);
                                uVar19 = (ulong)CONCAT31((int3)((uint)uVar31 >> 8),~(byte)uVar31);
                                if ((~(byte)uVar31 & 7) != 0) {
                                  if (!bVar32) goto LAB_00ac5fdd;
                                  aVar42 = aVar43.field_1;
                                  aVar38 = aVar40.field_1;
                                  if (bVar33) {
                                    aVar42 = aVar8;
                                    aVar38 = aVar10;
                                  }
                                  goto LAB_00ac6019;
                                }
                                aVar43.m128 = (__m128)minps(aVar43.m128,auVar39);
                                aVar40.m128 = (__m128)maxps(aVar40.m128,auVar39);
                                uVar25 = uVar25 + 1;
                                pauVar28 = (undefined1 (*) [16])(*pauVar28 + sVar5);
                              } while (uVar25 < uVar22);
                            }
                            uVar27 = uVar27 + 1;
                            bVar32 = uVar27 < uVar17;
                          } while (bVar32);
                        }
LAB_00ac5fdd:
                        aVar38 = aVar40.field_1;
                        aVar42 = aVar43.field_1;
                        uVar20 = uVar20 + 1;
                        bVar33 = uVar20 < uVar26;
                      } while (uVar20 != uVar26);
                    }
LAB_00ac6019:
                    if (!bVar33) {
                      aVar44.m128[3] = (float)geomID;
                      aVar44._0_4_ = aVar42.x;
                      aVar44._4_4_ = aVar42.y;
                      aVar44._8_4_ = aVar42.z;
                      aVar41.m128[3] = (float)local_90;
                      aVar41._0_4_ = aVar38.x;
                      aVar41._4_4_ = aVar38.y;
                      aVar41._8_4_ = aVar38.z;
                      aVar34.m128 = (__m128)minps(aVar34.m128,aVar44.m128);
                      aVar35.m128 = (__m128)maxps(aVar35.m128,aVar41.m128);
                      auVar45._0_4_ = aVar42.x + aVar38.x;
                      auVar45._4_4_ = aVar42.y + aVar38.y;
                      auVar45._8_4_ = aVar42.z + aVar38.z;
                      auVar45._12_4_ = (float)geomID + (float)local_90;
                      aVar37.m128 = (__m128)minps(aVar37.m128,auVar45);
                      aVar36.m128 = (__m128)maxps(aVar36.m128,auVar45);
                      local_98 = local_98 + 1;
                      sgrids->items[local_90] =
                           (SubGridBuildData)
                           ((ulong)(uVar14 & 0xfffe | (uint)(uVar12 <= uVar14 + 2) << 0xf) |
                            uVar18 << 0x20 |
                           (ulong)(uVar15 << 0x10 |
                                  (uint)((uint)*(ushort *)(lVar29 + 10 + lVar23) <= uVar15 + 2) <<
                                  0x1f));
                      pPVar6 = prims->items;
                      pPVar6[local_90].lower.field_0 = aVar44;
                      pPVar6[local_90].upper.field_0 = aVar41;
                      local_90 = local_90 + 1;
                    }
                    uVar14 = uVar14 + 2;
                    uVar12 = (uint)*(ushort *)(lVar29 + 8 + lVar23);
                  } while (uVar14 < uVar12 - 1);
                }
                uVar15 = uVar15 + 2;
              } while (uVar15 < *(ushort *)(lVar29 + 10 + lVar23) - 1);
            }
          }
        }
      }
LAB_00ac610b:
      uVar18 = uVar18 + 1;
    } while (uVar18 < r->_end);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar34;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar35;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar37;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar36;
  __return_storage_ptr__->end = local_98;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(mvector<PrimRef>& prims, mvector<SubGridBuildData>& sgrids, const range<size_t>& r, size_t k, unsigned int geomID) const override 
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j)) continue;
          const GridMesh::Grid &g = grid(j);
          
          for (unsigned int y=0; y<g.resY-1u; y+=2)
          {
            for (unsigned int x=0; x<g.resX-1u; x+=2)
            {
              BBox3fa bounds = empty;
              if (!buildBounds(g,x,y,bounds)) continue; // get bounds of subgrid
              const PrimRef prim(bounds,(unsigned)geomID,(unsigned)k);
              pinfo.add_center2(prim);
              sgrids[k] = SubGridBuildData(x | g.get3x3FlagsX(x), y | g.get3x3FlagsY(y), unsigned(j));
              prims[k++] = prim;                
            }
          }
        }
        return pinfo;
      }